

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_exp<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>
                      *src)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = *(ulong *)(src + 8);
  lVar6 = 0;
  for (uVar8 = 0; uVar8 != (~((long)uVar2 >> 0x3f) & uVar2); uVar8 = uVar8 + 1) {
    uVar3 = *(ulong *)(src + 0x10);
    lVar4 = (dest->data).nc_;
    pfVar5 = (dest->data).data;
    uVar9 = uVar8;
    for (uVar7 = 0; (~((long)uVar3 >> 0x3f) & uVar3) != uVar7; uVar7 = uVar7 + 1) {
      lVar1 = uVar9 * 4;
      uVar9 = uVar9 + uVar2;
      *(undefined4 *)((long)pfVar5 + uVar7 * 4 + lVar4 * lVar6) =
           *(undefined4 *)(*(long *)src + lVar1);
    }
    lVar6 = lVar6 + 4;
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - #dest == src
    !*/
    {
        for (long r = 0; r < src.nr(); ++r)
        {
            for (long c = 0; c < src.nc(); ++c)
            {
                dest(r,c) = src(r,c);
            }
        }
    }